

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O0

uint32_t tinyusdz::to_utf8_code(string *s)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  byte *pbVar6;
  uchar s3;
  uchar s2_1;
  uchar s1_2;
  uchar s0_3;
  uchar s2;
  uchar s1_1;
  uchar s0_2;
  uchar s1;
  uchar s0_1;
  uchar s0;
  uint32_t code;
  string *s_local;
  
  uVar4 = std::__cxx11::string::empty();
  if (((uVar4 & 1) == 0) && (uVar4 = std::__cxx11::string::size(), uVar4 < 5)) {
    lVar5 = std::__cxx11::string::size();
    if (lVar5 == 1) {
      pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)s);
      if (0x7f < *pbVar6) {
        return 0xffffffff;
      }
      _s1_2 = *pbVar6 & 0x7f;
    }
    else {
      lVar5 = std::__cxx11::string::size();
      if (lVar5 == 2) {
        pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)s);
        bVar1 = *pbVar6;
        pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)s);
        if (((bVar1 & 0xe0) != 0xc0) || ((*pbVar6 & 0xc0) != 0x80)) {
          return 0xffffffff;
        }
        _s1_2 = (bVar1 & 0x1f) << 6 | *pbVar6 & 0x3f;
      }
      else {
        lVar5 = std::__cxx11::string::size();
        if (lVar5 == 3) {
          pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)s);
          bVar1 = *pbVar6;
          pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)s);
          bVar2 = *pbVar6;
          pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)s);
          if ((((bVar1 & 0xf0) != 0xe0) || ((bVar2 & 0xc0) != 0x80)) || ((*pbVar6 & 0xc0) != 0x80))
          {
            return 0xffffffff;
          }
          _s1_2 = (bVar1 & 0xf) << 0xc | (bVar2 & 0x3f) << 6 | *pbVar6 & 0x3f;
        }
        else {
          pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)s);
          bVar1 = *pbVar6;
          pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)s);
          bVar2 = *pbVar6;
          pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)s);
          bVar3 = *pbVar6;
          pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)s);
          if (((((bVar1 & 0xf8) != 0xf0) || ((bVar2 & 0xc0) != 0x80)) || ((bVar3 & 0xc0) != 0x80))
             || ((bVar3 & 0xc0) != 0x80)) {
            return 0xffffffff;
          }
          _s1_2 = (bVar1 & 7) << 0x12 | (bVar2 & 0x3f) << 0xc | (bVar3 & 0x3f) << 6 | *pbVar6 & 0x3f
          ;
        }
      }
    }
    s_local._4_4_ = _s1_2;
  }
  else {
    s_local._4_4_ = 0xffffffff;
  }
  return s_local._4_4_;
}

Assistant:

uint32_t to_utf8_code(const std::string &s) {
  if (s.empty() || (s.size() > 4)) {
    return ~0u;  // invalid
  }

  // TODO: endianness.
  uint32_t code = 0;
  if (s.size() == 1) {
    unsigned char s0 = static_cast<unsigned char>(s[0]);
    if (s0 > 0x7f) {
      return ~0u;
    }
    code = uint32_t(s0) & 0x7f;
  } else if (s.size() == 2) {
    // 11bit: 110y-yyyx 10xx-xxxx
    unsigned char s0 = static_cast<unsigned char>(s[0]);
    unsigned char s1 = static_cast<unsigned char>(s[1]);

    if (((s0 & 0xe0) == 0xc0) && ((s1 & 0xc0) == 0x80)) {
      code = (uint32_t(s0 & 0x1f) << 6) | (s1 & 0x3f);
    } else {
      return ~0u;
    }
  } else if (s.size() == 3) {
    // 16bit: 1110-yyyy 10yx-xxxx 10xx-xxxx
    unsigned char s0 = static_cast<unsigned char>(s[0]);
    unsigned char s1 = static_cast<unsigned char>(s[1]);
    unsigned char s2 = static_cast<unsigned char>(s[2]);
    if (((s0 & 0xf0) == 0xe0) && ((s1 & 0xc0) == 0x80) &&
        ((s2 & 0xc0) == 0x80)) {
      code =
          (uint32_t(s0 & 0xf) << 12) | (uint32_t(s1 & 0x3f) << 6) | (s2 & 0x3f);
    } else {
      return ~0u;
    }
  } else {
    // 21bit: 1111-0yyy 10yy-xxxx 10xx-xxxx 10xx-xxxx
    unsigned char s0 = static_cast<unsigned char>(s[0]);
    unsigned char s1 = static_cast<unsigned char>(s[1]);
    unsigned char s2 = static_cast<unsigned char>(s[2]);
    unsigned char s3 = static_cast<unsigned char>(s[3]);
    if (((s0 & 0xf8) == 0xf0) && ((s1 & 0xc0) == 0x80) &&
        ((s2 & 0xc0) == 0x80) && ((s2 & 0xc0) == 0x80)) {
      code = (uint32_t(s0 & 0x7) << 18) | (uint32_t(s1 & 0x3f) << 12) |
             (uint32_t(s2 & 0x3f) << 6) | uint32_t(s3 & 0x3f);
    } else {
      return ~0u;
    }
  }

  return code;
}